

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::FCDUTF16CollationIterator::nextCodePoint
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar **ppUVar2;
  UChar UVar3;
  UChar *pUVar4;
  char cVar5;
  UBool UVar6;
  uint uVar7;
  UChar *pUVar8;
  
  cVar5 = this->checkDir;
  while (cVar5 < '\x01') {
    if ((cVar5 == '\0') &&
       (pUVar8 = (this->super_UTF16CollationIterator).pos,
       pUVar8 != (this->super_UTF16CollationIterator).limit)) goto LAB_0024e14d;
    switchToForward(this);
    cVar5 = this->checkDir;
  }
  pUVar8 = (this->super_UTF16CollationIterator).pos;
  pUVar4 = (this->super_UTF16CollationIterator).limit;
  uVar7 = 0xffffffff;
  if (pUVar8 != pUVar4) {
    ppUVar2 = &(this->super_UTF16CollationIterator).pos;
    pUVar1 = pUVar8 + 1;
    *ppUVar2 = pUVar1;
    UVar3 = *pUVar8;
    uVar7 = (uint)(ushort)UVar3;
    if ((((ushort)UVar3 < 0xc0) || ((ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] == 0))
       || ((*(uint *)(CollationFCD::tcccBits +
                     (ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] * 4) >> (uVar7 & 0x1f)
           & 1) == 0)) {
      if ((uVar7 == 0) && (uVar7 = 0, pUVar4 == (UChar *)0x0)) {
        (this->super_UTF16CollationIterator).pos = pUVar8;
        this->rawLimit = pUVar8;
        (this->super_UTF16CollationIterator).limit = pUVar8;
        return -1;
      }
    }
    else if (((uVar7 & 0xff01) == 0xf01) ||
            (((pUVar1 != pUVar4 && (UVar3 = *pUVar1, 0x2ff < (ushort)UVar3)) &&
             (((ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] != 0 &&
              ((*(uint *)(CollationFCD::lcccBits +
                         (ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] * 4) >>
                ((ushort)UVar3 & 0x1f) & 1) != 0)))))) {
      (this->super_UTF16CollationIterator).pos = pUVar8;
      UVar6 = nextSegment(this,errorCode);
      if (UVar6 == '\0') {
        return -1;
      }
      pUVar8 = *ppUVar2;
LAB_0024e14d:
      (this->super_UTF16CollationIterator).pos = pUVar8 + 1;
      uVar7 = (uint)(ushort)*pUVar8;
    }
    if ((((uVar7 & 0xfc00) == 0xd800) &&
        (pUVar8 = (this->super_UTF16CollationIterator).pos,
        pUVar8 != (this->super_UTF16CollationIterator).limit)) &&
       (UVar3 = *pUVar8, (UVar3 & 0xfc00U) == 0xdc00)) {
      (this->super_UTF16CollationIterator).pos = pUVar8 + 1;
      uVar7 = uVar7 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
    }
  }
  return uVar7;
}

Assistant:

UChar32
FCDUTF16CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                return U_SENTINEL;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    c = *pos++;
                }
            } else if(c == 0 && limit == NULL) {
                limit = rawLimit = --pos;
                return U_SENTINEL;
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}